

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O2

int __thiscall ktxInfo::main(ktxInfo *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  pointer pbVar8;
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  string *local_78;
  char *local_70 [4];
  string infile;
  
  iVar3 = 0;
  ktxApp::processCommandLine(&this->super_ktxApp,argc,argv,eAllowStdin,eNone);
  pbVar8 = (this->options).infiles.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (string *)&(this->super_ktxApp).name;
  do {
    if ((this->options).infiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= pbVar8) {
      return iVar3;
    }
    std::__cxx11::string::string((string *)&infile,(string *)pbVar8);
    iVar2 = std::__cxx11::string::compare((char *)&infile);
    pFVar4 = _stdin;
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"rb",&local_79);
      pFVar4 = fopen(infile._M_dataplus._M_p,local_70[0]);
      std::__cxx11::string::~string((string *)local_70);
    }
    if (pFVar4 == (FILE *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,local_78);
      poVar5 = std::operator<<(poVar5," could not open input file \"");
      iVar3 = std::__cxx11::string::compare((char *)&infile);
      if (iVar3 == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"stdin",&local_7d);
      }
      else {
        std::__cxx11::string::string((string *)local_70,(string *)&infile);
      }
      poVar5 = std::operator<<(poVar5,(string *)local_70);
      poVar5 = std::operator<<(poVar5,"\". ");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_00104b0a:
      std::__cxx11::string::~string((string *)local_70);
      bVar1 = false;
      iVar3 = 2;
    }
    else {
      iVar2 = ktxPrintInfoForStdioStream(pFVar4);
      if (iVar2 == 5) {
        poVar5 = std::operator<<((ostream *)&std::cerr,local_78);
        poVar5 = std::operator<<(poVar5,": Error reading \"");
        iVar3 = std::__cxx11::string::compare((char *)&infile);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"stdin",&local_7c);
        }
        else {
          std::__cxx11::string::string((string *)local_70,(string *)&infile);
        }
        poVar5 = std::operator<<(poVar5,(string *)local_70);
        poVar5 = std::operator<<(poVar5,"\".");
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00104b0a;
      }
      if (iVar2 == 0xf) {
        poVar5 = std::operator<<((ostream *)&std::cerr,local_78);
        poVar5 = std::operator<<(poVar5,": ");
        iVar3 = std::__cxx11::string::compare((char *)&infile);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"stdin",&local_7b);
        }
        else {
          std::__cxx11::string::string((string *)local_70,(string *)&infile);
        }
        poVar5 = std::operator<<(poVar5,(string *)local_70);
        poVar5 = std::operator<<(poVar5," is not a KTX or KTX2 file.");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00104b0a;
      }
      bVar1 = true;
      if (iVar2 == 7) {
        poVar5 = std::operator<<((ostream *)&std::cerr,local_78);
        poVar5 = std::operator<<(poVar5,": Unexpected end of file reading \"");
        iVar3 = std::__cxx11::string::compare((char *)&infile);
        if (iVar3 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"stdin",&local_7a);
        }
        else {
          std::__cxx11::string::string((string *)local_70,(string *)&infile);
        }
        poVar5 = std::operator<<(poVar5,(string *)local_70);
        poVar5 = std::operator<<(poVar5,"\".");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00104b0a;
      }
    }
    std::__cxx11::string::~string((string *)&infile);
    pbVar8 = pbVar8 + 1;
    if (!bVar1) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int
ktxInfo::main(int argc, char* argv[])
{
    FILE *inf;
    int exitCode = 0;

    processCommandLine(argc, argv);

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
       string infile = *it;

        if (!infile.compare("-")) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            KTX_error_code result;

            result = ktxPrintInfoForStdioStream(inf);
            if (result ==  KTX_FILE_UNEXPECTED_EOF) {
                cerr << name
                     << ": Unexpected end of file reading \""
                     << (infile.compare("-") ? infile : "stdin" ) << "\"."
                     << endl;
                exitCode = 2;
                goto cleanup;
            }
            if (result == KTX_UNKNOWN_FILE_FORMAT) {
                cerr << name
                     << ": " << (infile.compare("-") ? infile : "stdin")
                     << " is not a KTX or KTX2 file."
                     << endl;
                exitCode = 2;
                goto cleanup;
            }
            if (result == KTX_FILE_READ_ERROR) {
                cerr << name
                    << ": Error reading \""
                    << (infile.compare("-") ? infile : "stdin") << "\"."
                    << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") ? infile : "stdin") << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }

cleanup:
    return exitCode;
}